

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O0

bool SigHasLowR(secp256k1_ecdsa_signature *sig)

{
  long in_FS_OFFSET;
  uchar compact_sig [64];
  undefined1 local_48;
  secp256k1_ecdsa_signature *in_stack_ffffffffffffffe8;
  uchar *in_stack_fffffffffffffff0;
  secp256k1_context *ctx;
  
  ctx = *(secp256k1_context **)(in_FS_OFFSET + 0x28);
  secp256k1_ecdsa_signature_serialize_compact
            (ctx,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  if (*(secp256k1_context **)(in_FS_OFFSET + 0x28) == ctx) {
    return local_48 < 0x80;
  }
  __stack_chk_fail();
}

Assistant:

bool SigHasLowR(const secp256k1_ecdsa_signature* sig)
{
    unsigned char compact_sig[64];
    secp256k1_ecdsa_signature_serialize_compact(secp256k1_context_sign, compact_sig, sig);

    // In DER serialization, all values are interpreted as big-endian, signed integers. The highest bit in the integer indicates
    // its signed-ness; 0 is positive, 1 is negative. When the value is interpreted as a negative integer, it must be converted
    // to a positive value by prepending a 0x00 byte so that the highest bit is 0. We can avoid this prepending by ensuring that
    // our highest bit is always 0, and thus we must check that the first byte is less than 0x80.
    return compact_sig[0] < 0x80;
}